

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polyline_shape.cc
# Opt level: O3

Edge * __thiscall
S2LaxPolylineShape::chain_edge(Edge *__return_storage_ptr__,S2LaxPolylineShape *this,int i,int j)

{
  int iVar1;
  Vector3<double> *pVVar2;
  VType VVar3;
  int iVar4;
  S2LogMessage SStack_18;
  
  if (i == 0) {
    iVar1 = *(int *)&(this->super_S2Shape).field_0xc;
    iVar4 = 1;
    if (1 < iVar1) {
      iVar4 = iVar1;
    }
    if (j < iVar4 + -1) {
      pVVar2 = (this->vertices_)._M_t.
               super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
               super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
               super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
      (__return_storage_ptr__->v0).c_[2] = pVVar2[j].c_[2];
      VVar3 = pVVar2[j].c_[1];
      (__return_storage_ptr__->v0).c_[0] = pVVar2[j].c_[0];
      (__return_storage_ptr__->v0).c_[1] = VVar3;
      VVar3 = pVVar2[(long)j + 1].c_[1];
      (__return_storage_ptr__->v1).c_[0] = pVVar2[(long)j + 1].c_[0];
      (__return_storage_ptr__->v1).c_[1] = VVar3;
      (__return_storage_ptr__->v1).c_[2] = pVVar2[(long)j + 1].c_[2];
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polyline_shape.cc"
               ,0x55,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (j) < (num_edges()) ",0x22);
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polyline_shape.cc"
               ,0x54,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (i) == (0) ",0x19);
  }
  abort();
}

Assistant:

S2Shape::Edge S2LaxPolylineShape::chain_edge(int i, int j) const {
  S2_DCHECK_EQ(i, 0);
  S2_DCHECK_LT(j, num_edges());
  return Edge(vertex(j), vertex(j + 1));
}